

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void duckdb::ValidateOffsetInFile
               (string *filename,idx_t col_idx,idx_t file_length,idx_t offset,string *offset_name)

{
  pointer pcVar1;
  IOException *this;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (offset < file_length) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "File \'%s\': metadata is corrupt. Column %d has invalid %s (offset=%llu file_size=%llu)."
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + filename->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (offset_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + offset_name->_M_string_length);
  IOException::
  IOException<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
            (this,&local_90,&local_50,col_idx,&local_70,offset,file_length);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ValidateOffsetInFile(const string &filename, idx_t col_idx, idx_t file_length, idx_t offset,
                                 const string &offset_name) {
	if (offset >= file_length) {
		throw IOException("File '%s': metadata is corrupt. Column %d has invalid "
		                  "%s (offset=%llu file_size=%llu).",
		                  filename, col_idx, offset_name, offset, file_length);
	}
}